

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O2

bool __thiscall VW::config::options_boost_po::was_supplied(options_boost_po *this,string *key)

{
  pointer pbVar1;
  pointer pbVar2;
  size_type sVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->m_supplied_options,key);
  bVar5 = true;
  if (sVar3 == 0) {
    pbVar1 = (this->m_command_line).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->m_command_line).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::operator+(&bStack_48,"--",key);
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (pbVar1,pbVar2,&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    bVar5 = _Var4._M_current !=
            (this->m_command_line).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar5;
}

Assistant:

bool options_boost_po::was_supplied(const std::string& key)
{
  // Best check, only valid after options parsed.
  if (m_supplied_options.count(key) > 0)
  {
    return true;
  }

  // Basic check, string match against command line.
  auto it = std::find(m_command_line.begin(), m_command_line.end(), std::string("--" + key));
  return it != m_command_line.end();
}